

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O0

MppBuffer camera_frame_to_buf(CamSource *ctx,RK_S32 idx)

{
  MppBuffer buf;
  RK_S32 idx_local;
  CamSource *ctx_local;
  
  if (idx < 0) {
    ctx_local = (CamSource *)0x0;
  }
  else {
    ctx_local = (CamSource *)ctx->fbuf[idx].buffer;
    if (ctx_local != (CamSource *)0x0) {
      mpp_buffer_sync_end_f(ctx_local,0,"camera_frame_to_buf");
    }
  }
  return ctx_local;
}

Assistant:

MppBuffer camera_frame_to_buf(CamSource *ctx, RK_S32 idx)
{
    MppBuffer buf = NULL;

    if (idx < 0)
        return buf;

    buf = ctx->fbuf[idx].buffer;
    if (buf)
        mpp_buffer_sync_end(buf);

    return buf;
}